

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O3

bool GetNameProxy(Proxy *nameProxyOut)

{
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock7;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = (mutex_type *)&g_proxyinfo_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  if (nameProxy.m_is_unix_socket == true) {
    bVar3 = IsUnixSocketPath(&nameProxy.m_unix_socket_path);
  }
  else {
    bVar3 = CNetAddr::IsValid((CNetAddr *)&nameProxy);
  }
  if (bVar3 != false) {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)nameProxyOut,
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&nameProxy);
    uVar1 = nameProxy.proxy.super_CNetAddr.m_scope_id;
    (nameProxyOut->proxy).super_CNetAddr.m_net = nameProxy.proxy.super_CNetAddr.m_net;
    (nameProxyOut->proxy).super_CNetAddr.m_scope_id = uVar1;
    (nameProxyOut->proxy).port = nameProxy.proxy.port;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&nameProxyOut->m_unix_socket_path,&nameProxy.m_unix_socket_path);
    bVar2 = nameProxy.m_randomize_credentials;
    nameProxyOut->m_is_unix_socket = nameProxy.m_is_unix_socket;
    nameProxyOut->m_randomize_credentials = bVar2;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool GetNameProxy(Proxy &nameProxyOut) {
    LOCK(g_proxyinfo_mutex);
    if(!nameProxy.IsValid())
        return false;
    nameProxyOut = nameProxy;
    return true;
}